

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors2Return
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,bool raii)

{
  Flags<CommandFlavourFlagBits> *this_00;
  allocator<Flags<CommandFlavourFlagBits>_> *this_01;
  value_type vVar1;
  size_t sVar2;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_00;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_01;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_02;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  size_type sVar8;
  pointer ppVar9;
  byte local_371;
  allocator<char> local_24c;
  allocator<Flags<CommandFlavourFlagBits>_> local_24b;
  Flags<CommandFlavourFlagBits> local_24a;
  Flags<CommandFlavourFlagBits> local_249;
  Flags<CommandFlavourFlagBits> *local_248;
  size_type local_240;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_238;
  allocator<Flags<CommandFlavourFlagBits>_> local_21c;
  Flags<CommandFlavourFlagBits> local_21b;
  Flags<CommandFlavourFlagBits> local_21a;
  Flags<CommandFlavourFlagBits> local_219;
  Flags<CommandFlavourFlagBits> *local_218;
  size_type local_210;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_208;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_1f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1c0;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_1a8;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_1a0;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_198;
  _Base_ptr local_190;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_188;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_180;
  _Base_ptr local_178;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_170;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_168;
  _Base_ptr local_160;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_158;
  undefined1 local_150 [8];
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_1;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_108;
  allocator<Flags<CommandFlavourFlagBits>_> local_ea;
  Flags<CommandFlavourFlagBits> local_e9;
  Flags<CommandFlavourFlagBits> *local_e8;
  size_type local_e0;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_d8;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  undefined1 local_68 [8];
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams;
  bool raii_local;
  bool definition_local;
  size_t initialSkipCount_local;
  CommandData *commandData_local;
  string *name_local;
  VulkanHppGenerator *this_local;
  
  vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = raii;
  vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = definition;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](returnParams,0);
  pvVar7 = std::
           vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
           operator[](&commandData->params,*pvVar6);
  bVar5 = std::operator==(&(pvVar7->type).type,"size_t");
  if (bVar5) {
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](returnParams,1);
    pvVar7 = std::
             vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
             operator[](&commandData->params,*pvVar6);
    bVar5 = std::operator==(&(pvVar7->type).type,"void");
    if (!bVar5) goto LAB_0016c79a;
    determineVectorParams
              ((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                *)local_68,this,&commandData->params);
    sVar8 = std::
            map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            ::size((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                    *)local_68);
    bVar4 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
    if (sVar8 == 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_80,returnParams);
      std::
      map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::map(&local_c0,
            (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
             *)local_68);
      Flags<CommandFlavourFlagBits>::Flags(&local_e9,enhanced);
      local_e0 = 1;
      local_e8 = &local_e9;
      std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_ea);
      __l_02._M_len = local_e0;
      __l_02._M_array = local_e8;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector(&local_d8,__l_02,&local_ea);
      bVar3 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_;
      this_00 = (Flags<CommandFlavourFlagBits> *)
                ((long)&vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
      Flags<CommandFlavourFlagBits>::Flags(this_00,enhanced);
      this_01 = (allocator<Flags<CommandFlavourFlagBits>_> *)
                ((long)&vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count + 6);
      std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(this_01);
      __l_01._M_len = 1;
      __l_01._M_array = this_00;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector(&local_108,__l_01,this_01);
      generateCommandSetInclusive
                (__return_storage_ptr__,this,name,commandData,initialSkipCount,(bool)(bVar4 & 1),
                 &local_80,&local_c0,false,&local_d8,(bool)(bVar3 & 1),false,&local_108);
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      ~vector(&local_108);
      std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator
                ((allocator<Flags<CommandFlavourFlagBits>_> *)
                 ((long)&vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      ~vector(&local_d8);
      std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_ea);
      std::
      map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::~map(&local_c0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_80);
    }
    vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count._1_3_ = 0;
    vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = sVar8 == 1;
    std::
    map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::~map((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            *)local_68);
  }
  else {
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](returnParams,0);
    pvVar7 = std::
             vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
             operator[](&commandData->params,*pvVar6);
    bVar5 = std::operator==(&(pvVar7->type).type,"void");
    if (((bVar5 ^ 0xffU) & 1) == 0) goto LAB_0016c79a;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](returnParams,0);
    pvVar7 = std::
             vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
             operator[](&commandData->params,*pvVar6);
    bVar5 = isHandleType(this,&(pvVar7->type).type);
    if (bVar5) goto LAB_0016c79a;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](returnParams,0);
    pvVar7 = std::
             vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
             operator[](&commandData->params,*pvVar6);
    bVar5 = isStructureChainAnchor(this,&(pvVar7->type).type);
    if (bVar5) goto LAB_0016c79a;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](returnParams,1);
    pvVar7 = std::
             vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
             operator[](&commandData->params,*pvVar6);
    bVar5 = std::operator==(&(pvVar7->type).type,"void");
    if (((bVar5 ^ 0xffU) & 1) == 0) goto LAB_0016c79a;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](returnParams,1);
    pvVar7 = std::
             vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
             operator[](&commandData->params,*pvVar6);
    bVar5 = isHandleType(this,&(pvVar7->type).type);
    if (bVar5) goto LAB_0016c79a;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](returnParams,1);
    pvVar7 = std::
             vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
             operator[](&commandData->params,*pvVar6);
    bVar5 = isStructureChainAnchor(this,&(pvVar7->type).type);
    if (bVar5) goto LAB_0016c79a;
    determineVectorParams
              ((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                *)local_150,this,&commandData->params);
    sVar8 = std::
            map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            ::size((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                    *)local_150);
    if (sVar8 == 2) {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (returnParams,0);
      vVar1 = *pvVar6;
      local_160 = (_Base_ptr)
                  std::
                  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                  ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                           *)local_150);
      local_158 = std::
                  next<std::_Rb_tree_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                            ((_Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                              )local_160,1);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
               ::operator->(&local_158);
      if (vVar1 != ppVar9->first) goto LAB_0016c762;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (returnParams,1);
      bVar5 = std::
              map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::contains((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                          *)local_150,pvVar6);
      if (bVar5) goto LAB_0016c762;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (returnParams,1);
      vVar1 = *pvVar6;
      local_168._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
           ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                    *)local_150);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
               ::operator->(&local_168);
      bVar5 = false;
      if (vVar1 != (ppVar9->second).lenParam) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (returnParams,1);
        vVar1 = *pvVar6;
        local_178 = (_Base_ptr)
                    std::
                    map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                    ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                             *)local_150);
        local_170 = std::
                    next<std::_Rb_tree_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                              ((_Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                                )local_178,1);
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                 ::operator->(&local_170);
        bVar5 = vVar1 != (ppVar9->second).lenParam;
      }
      if (!bVar5) {
        __assert_fail("( returnParams[1] != vectorParams.begin()->second.lenParam ) && ( returnParams[1] != std::next( vectorParams.begin() )->second.lenParam )"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x112b,
                      "std::string VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors2Return(const std::string &, const CommandData &, size_t, bool, const std::vector<size_t> &, bool) const"
                     );
      }
      local_180._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
           ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                    *)local_150);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
               ::operator->(&local_180);
      sVar2 = (ppVar9->second).lenParam;
      local_190 = (_Base_ptr)
                  std::
                  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                  ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                           *)local_150);
      local_188 = std::
                  next<std::_Rb_tree_iterator<std::pair<unsigned_long_const,VulkanHppGenerator::VectorParamData>>>
                            ((_Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                              )local_190,1);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
               ::operator->(&local_188);
      if (sVar2 != (ppVar9->second).lenParam) goto LAB_0016c762;
      local_198._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
           ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                    *)local_150);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
               ::operator->(&local_198);
      pvVar7 = std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::operator[](&commandData->params,(ppVar9->second).lenParam);
      bVar5 = TypeInfo::isValue(&pvVar7->type);
      if (!bVar5) goto LAB_0016c762;
      local_1a0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
           ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                    *)local_150);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
               ::operator->(&local_1a0);
      pvVar7 = std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::operator[](&commandData->params,ppVar9->first);
      bVar5 = isStructureType(this,&(pvVar7->type).type);
      local_371 = 0;
      if (bVar5) {
        local_1a8._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
             ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                      *)local_150);
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                 ::operator->(&local_1a8);
        pvVar7 = std::
                 vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 ::operator[](&commandData->params,ppVar9->first);
        bVar5 = isStructureChainAnchor(this,&(pvVar7->type).type);
        local_371 = bVar5 ^ 0xff;
      }
      bVar4 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
      if ((local_371 & 1) == 0) goto LAB_0016c762;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1c0,returnParams);
      std::
      map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::map(&local_1f0,
            (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
             *)local_150);
      Flags<CommandFlavourFlagBits>::Flags(&local_21b,enhanced);
      Flags<CommandFlavourFlagBits>::Flags(&local_21a,withAllocator);
      Flags<CommandFlavourFlagBits>::Flags(&local_219,singular);
      local_210 = 3;
      local_218 = &local_21b;
      std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_21c);
      __l_00._M_len = local_210;
      __l_00._M_array = local_218;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector(&local_208,__l_00,&local_21c);
      bVar3 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_;
      Flags<CommandFlavourFlagBits>::Flags(&local_24a,enhanced);
      Flags<CommandFlavourFlagBits>::Flags(&local_249,singular);
      local_240 = 2;
      local_248 = &local_24a;
      std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_24b);
      __l._M_len = local_240;
      __l._M_array = local_248;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector(&local_238,__l,&local_24b);
      generateCommandSetInclusive
                (__return_storage_ptr__,this,name,commandData,initialSkipCount,(bool)(bVar4 & 1),
                 &local_1c0,&local_1f0,false,&local_208,(bool)(bVar3 & 1),false,&local_238);
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      ~vector(&local_238);
      std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_24b);
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      ~vector(&local_208);
      std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_21c);
      std::
      map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::~map(&local_1f0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_1c0);
      vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    }
    else {
LAB_0016c762:
      vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
    }
    std::
    map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::~map((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            *)local_150);
  }
  if ((uint)vectorParams_1._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    return __return_storage_ptr__;
  }
LAB_0016c79a:
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_24c)
  ;
  std::allocator<char>::~allocator(&local_24c);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors2Return( std::string const &         name,
                                                                                     CommandData const &         commandData,
                                                                                     size_t                      initialSkipCount,
                                                                                     bool                        definition,
                                                                                     std::vector<size_t> const & returnParams,
                                                                                     bool                        raii ) const
{
  if ( commandData.params[returnParams[0]].type.type == "size_t" )
  {
    if ( commandData.params[returnParams[1]].type.type == "void" )
    {
      std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
      if ( vectorParams.size() == 1 )
      {
        return generateCommandSetInclusive( name,
                                            commandData,
                                            initialSkipCount,
                                            definition,
                                            returnParams,
                                            vectorParams,
                                            false,
                                            { CommandFlavourFlagBits::enhanced },
                                            raii,
                                            false,
                                            { CommandFlavourFlagBits::enhanced } );
      }
    }
  }
  else if ( ( commandData.params[returnParams[0]].type.type != "void" ) && !isHandleType( commandData.params[returnParams[0]].type.type ) &&
            !isStructureChainAnchor( commandData.params[returnParams[0]].type.type ) )
  {
    if ( ( commandData.params[returnParams[1]].type.type != "void" ) && !isHandleType( commandData.params[returnParams[1]].type.type ) &&
         !isStructureChainAnchor( commandData.params[returnParams[1]].type.type ) )
    {
      std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
      if ( vectorParams.size() == 2 )
      {
        if ( returnParams[0] == std::next( vectorParams.begin() )->first )
        {
          if ( !vectorParams.contains( returnParams[1] ) )
          {
            assert( ( returnParams[1] != vectorParams.begin()->second.lenParam ) && ( returnParams[1] != std::next( vectorParams.begin() )->second.lenParam ) );
            if ( vectorParams.begin()->second.lenParam == std::next( vectorParams.begin() )->second.lenParam )
            {
              if ( commandData.params[vectorParams.begin()->second.lenParam].type.isValue() )
              {
                if ( isStructureType( commandData.params[vectorParams.begin()->first].type.type ) &&
                     !isStructureChainAnchor( commandData.params[vectorParams.begin()->first].type.type ) )
                {
                  return generateCommandSetInclusive(
                    name,
                    commandData,
                    initialSkipCount,
                    definition,
                    returnParams,
                    vectorParams,
                    false,
                    { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::withAllocator, CommandFlavourFlagBits::singular },
                    raii,
                    false,
                    { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::singular } );
                }
              }
            }
          }
        }
      }
    }
  }
  return "";
}